

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O2

region * __thiscall
toml::detail::literal::scan(region *__return_storage_ptr__,literal *this,location *loc)

{
  char_type_conflict cVar1;
  element_type *peVar2;
  char_type_conflict cVar3;
  size_t i;
  ulong uVar4;
  location first;
  
  location::location(&first,loc);
  uVar4 = 0;
  do {
    if (this->size_ <= uVar4) {
      region::region(__return_storage_ptr__,&first,loc);
LAB_0031ba19:
      location::~location(&first);
      return __return_storage_ptr__;
    }
    peVar2 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if ((ulong)((long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= loc->location_) {
LAB_0031b9f6:
      location::operator=(loc,&first);
      region::region(__return_storage_ptr__);
      goto LAB_0031ba19;
    }
    cVar1 = this->value_[uVar4];
    cVar3 = location::current(loc);
    if (cVar1 != cVar3) goto LAB_0031b9f6;
    location::advance(loc,1);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

TOML11_INLINE region literal::scan(location& loc) const
{
    const auto first = loc;
    for(std::size_t i=0; i<size_; ++i)
    {
        if(loc.eof() || char_type(value_[i]) != loc.current())
        {
            loc = first;
            return region{};
        }
        loc.advance(1);
    }
    return region(first, loc);
}